

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O2

bool __thiscall Matrix<int>::operator!=(Matrix<int> *this,Matrix<int> *op2)

{
  int *piVar1;
  int *piVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar3 = this->n;
  uVar5 = 0;
  uVar4 = (ulong)(uint)this->m;
  if (this->m < 1) {
    uVar4 = uVar5;
  }
  uVar6 = 0;
  if (0 < (int)uVar3) {
    uVar6 = (ulong)uVar3;
  }
  for (; uVar5 != uVar6; uVar5 = uVar5 + 1) {
    uVar7 = 0;
    while (uVar4 != uVar7) {
      piVar1 = this->M[uVar5] + uVar7;
      piVar2 = op2->M[uVar5] + uVar7;
      uVar7 = uVar7 + 1;
      if (*piVar1 == *piVar2) goto LAB_0010b56f;
    }
  }
LAB_0010b56f:
  return (long)(int)uVar3 <= (long)uVar5;
}

Assistant:

bool operator!=(const Matrix<T>& op2) const {
    for (int i = 0; i < n; i++) {
      for (int j = 0; j < m; j++) {
        if (M[i][j] == op2.M[i][j]) {
          return false;
        }
      }
    }
    return true;
  }